

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

DWORD GetThreadId(HANDLE hThread)

{
  SIZE_T SVar1;
  IPalObject *local_30;
  IPalObject *pobjThread;
  CPalThread *pCStack_20;
  PAL_ERROR palError;
  CPalThread *pThread;
  HANDLE pVStack_10;
  DWORD dwThreadId;
  HANDLE hThread_local;
  
  pThread._4_4_ = 0;
  pobjThread._4_4_ = 0;
  local_30 = (IPalObject *)0x0;
  pVStack_10 = hThread;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pCStack_20 = CorUnix::InternalGetCurrentThread();
  pobjThread._4_4_ =
       CorUnix::InternalGetThreadDataFromHandle
                 (pCStack_20,pVStack_10,0,(CPalThread **)0x0,&local_30);
  if (pobjThread._4_4_ != 0) {
    SVar1 = CorUnix::CPalThread::GetThreadId(pCStack_20);
    pThread._4_4_ = (DWORD)SVar1;
  }
  if (local_30 != (IPalObject *)0x0) {
    (*local_30->_vptr_IPalObject[8])(local_30,pCStack_20);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return pThread._4_4_;
}

Assistant:

DWORD
PALAPI
GetThreadId(
    HANDLE hThread
    // UNIXTODO Should take pThread parameter here (modify callers)
    )
{
    DWORD dwThreadId = 0;
    CPalThread *pThread;
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjThread = 0;

    // TODO: not sure if this could be done in a more efficient way.
    PERF_ENTRY(GetThreadId);
    ENTRY("GetThreadId()\n");

    pThread = InternalGetCurrentThread();

    palError = InternalGetThreadDataFromHandle(
        pThread,
        hThread,
        0,
        0,
        &pobjThread
        );

    if (NO_ERROR != palError)
    {
        dwThreadId = (DWORD)pThread->GetThreadId();
    }

    if (NULL != pobjThread)
    {
        pobjThread->ReleaseReference(pThread);
    }

    LOGEXIT("GetThreadId returns DWORD %#x\n", dwThreadId);
    PERF_EXIT(GetThreadId);

    return dwThreadId;
}